

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLDCM.cpp
# Opt level: O2

Matrix33 *
AML::dcmKinematicRates_WorldRates
          (Matrix33 *__return_storage_ptr__,Matrix33 *dcm,Vector3 *worldRates)

{
  Matrix33 skewMatrix;
  double local_a8;
  double local_a0;
  double local_90;
  undefined8 local_88;
  undefined4 local_80;
  uint uStack_7c;
  undefined4 uStack_78;
  uint uStack_74;
  undefined4 local_70;
  uint uStack_6c;
  undefined8 local_68;
  Matrix33 local_60;
  
  local_a8 = 0.0;
  local_a0 = -(worldRates->field_0).data[2];
  local_88 = 0;
  local_80 = *(undefined4 *)&worldRates->field_0;
  uStack_6c = *(uint *)((long)&worldRates->field_0 + 4);
  uStack_78 = *(undefined4 *)((worldRates->field_0).data + 1);
  local_90 = (worldRates->field_0).data[1];
  uStack_7c = uStack_6c ^ 0x80000000;
  uStack_74 = *(uint *)((long)&worldRates->field_0 + 0xc) ^ 0x80000000;
  local_68 = 0;
  local_70 = local_80;
  Matrix33::Matrix33(&local_60,&local_a8);
  operator*(__return_storage_ptr__,dcm,&local_60);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 dcmKinematicRates_WorldRates(const Matrix33& dcm, const Vector3& worldRates)
    {
        const double p = worldRates.x;
        const double q = worldRates.y;
        const double r = worldRates.z;
        const double skewMatrixData[9] = { 0.0, -r, q, r, 0.0, -p, -q, p, 0.0 };
        const Matrix33 skewMatrix = Matrix33(skewMatrixData);
        return dcm * skewMatrix;
    }